

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileImporter::InternReadFile
          (Q3BSPFileImporter *this,string *rFile,aiScene *scene,IOSystem *ioHandler)

{
  bool bVar1;
  DeadlyImportError *this_00;
  ulong uVar2;
  Q3BSPModel *pModel;
  Q3BSPModel *pBSPModel;
  Q3BSPFileParser fileParser;
  undefined1 local_f0 [8];
  string mapName;
  undefined1 local_c8 [8];
  string archiveName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  ZipArchiveIOSystem Archive;
  IOSystem *ioHandler_local;
  aiScene *scene_local;
  string *rFile_local;
  Q3BSPFileImporter *this_local;
  
  Archive.pImpl = (Implement *)ioHandler;
  ZipArchiveIOSystem::ZipArchiveIOSystem((ZipArchiveIOSystem *)local_50,ioHandler,rFile,"r");
  bVar1 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)local_50);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,"",(allocator<char> *)(mapName.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(mapName.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"",(allocator<char> *)((long)&fileParser.m_pZipArchive + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fileParser.m_pZipArchive + 7));
    separateMapName(this,rFile,(string *)local_c8,(string *)local_f0);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) ||
       (bVar1 = findFirstMapInArchive(this,(ZipArchiveIOSystem *)local_50,(string *)local_f0), bVar1
       )) {
      Q3BSPFileParser::Q3BSPFileParser
                ((Q3BSPFileParser *)&pBSPModel,(string *)local_f0,(ZipArchiveIOSystem *)local_50);
      pModel = Q3BSPFileParser::getModel((Q3BSPFileParser *)&pBSPModel);
      if (pModel != (Q3BSPModel *)0x0) {
        CreateDataFromImport(this,pModel,scene,(ZipArchiveIOSystem *)local_50);
      }
      Q3BSPFileParser::~Q3BSPFileParser((Q3BSPFileParser *)&pBSPModel);
      fileParser.m_pZipArchive._0_4_ = 0;
    }
    else {
      fileParser.m_pZipArchive._0_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_c8);
    ZipArchiveIOSystem::~ZipArchiveIOSystem((ZipArchiveIOSystem *)local_50);
    return;
  }
  archiveName.field_2._M_local_buf[0xf] = '\x01';
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_a0,"Failed to open file ",rFile);
  std::operator+(&local_80,&local_a0,".");
  DeadlyImportError::DeadlyImportError(this_00,&local_80);
  archiveName.field_2._M_local_buf[0xf] = '\0';
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void Q3BSPFileImporter::InternReadFile(const std::string &rFile, aiScene* scene, IOSystem* ioHandler) {
    ZipArchiveIOSystem Archive( ioHandler, rFile );
    if ( !Archive.isOpen() ) {
        throw DeadlyImportError( "Failed to open file " + rFile + "." );
    }

    std::string archiveName( "" ), mapName( "" );
    separateMapName( rFile, archiveName, mapName );

    if ( mapName.empty() ) {
        if ( !findFirstMapInArchive( Archive, mapName ) ) {
            return;
        }
    }

    Q3BSPFileParser fileParser( mapName, &Archive );
    Q3BSPModel *pBSPModel = fileParser.getModel();
    if ( nullptr != pBSPModel ) {
        CreateDataFromImport( pBSPModel, scene, &Archive );
    }
}